

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O1

pmh_tables<8UL,_frozen::elsa<int>_> * __thiscall
frozen::bits::
make_pmh_tables<8ul,std::pair<int_const,int>,3ul,frozen::elsa<int>,frozen::bits::GetKey,std::equal_to<int>,frozen::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
          (pmh_tables<8UL,_frozen::elsa<int>_> *__return_storage_ptr__,bits *this,
          carray<std::pair<const_int,_int>,_3UL> *items,elsa<int> *hash,equal_to<int> *equal,
          GetKey *key,linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> prg)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  carray<unsigned_long,_8UL> H;
  carray<frozen::bits::seed_or_index,_8UL> G;
  carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> buckets;
  pmh_buckets<8UL> step_one;
  GetKey *local_2b0;
  ulong local_2a8 [6];
  unsigned_long local_278 [8];
  value_type local_238;
  value_type vStack_230;
  value_type local_228;
  value_type vStack_220;
  value_type local_218;
  value_type vStack_210;
  value_type local_208;
  value_type vStack_200;
  carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> local_1f8;
  pmh_buckets<8UL> local_178;
  
  local_2b0 = key;
  make_pmh_buckets<8ul,std::pair<int_const,int>,3ul,frozen::elsa<int>,frozen::bits::GetKey,frozen::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
            (&local_178,this,items,(elsa<int> *)equal,(GetKey *)&local_2b0,
             (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)key);
  lVar6 = 0;
  do {
    uVar1 = *(ulong *)((long)local_178.buckets.data_[0].data + lVar6 + 0x20);
    if (1 < uVar1) {
      uVar8 = 1;
      do {
        if (*(int *)this == *(int *)(this + uVar8 * 8)) {
          __assert_fail("!equal(key(items[0]), key(items[i])) && \"unique keys\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/include/frozen/bits/pmh.h"
                        ,0xc9,
                        "pmh_tables<M, Hash> frozen::bits::make_pmh_tables(const carray<Item, N> &, const Hash &, const KeyEqual &, const Key &, PRG) [M = 8UL, Item = std::pair<const int, int>, N = 3UL, Hash = frozen::elsa<int>, Key = frozen::bits::GetKey, KeyEqual = std::equal_to<int>, PRG = frozen::linear_congruential_engine<unsigned long, 48271, 0, 2147483647>]"
                       );
        }
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x140);
  pmh_buckets<8UL>::get_sorted_buckets(&local_1f8,&local_178);
  local_238 = 3;
  vStack_230 = 3;
  local_228 = 3;
  vStack_220 = 3;
  local_218 = 3;
  vStack_210 = 3;
  local_208 = 3;
  vStack_200 = 3;
  local_278[0] = 3;
  local_278[1] = 3;
  local_278[2] = 3;
  local_278[3] = 3;
  local_278[4] = 3;
  local_278[5] = 3;
  local_278[6] = 3;
  local_278[7] = 3;
  lVar6 = 0;
  do {
    puVar2 = *(ulong **)((long)&local_1f8.data_[0].ptr + lVar6);
    uVar1 = puVar2[4];
    if (uVar1 != 0) {
      if (uVar1 == 1) {
        local_278[(ulong)*(uint *)((long)&local_1f8.data_[0].hash + lVar6) + 8] =
             *puVar2 & 0x7fffffffffffffff;
      }
      else {
        local_2b0 = (GetKey *)((ulong)((long)local_2b0 * 0xbc8f) % 0x7fffffff);
        uVar7 = (ulong)local_2b0 | 0x8000000000000000;
        local_2a8[2] = 0;
        local_2a8[3] = 0;
        local_2a8[0] = 0;
        local_2a8[1] = 0;
        local_2a8[4] = 0;
        lVar3 = *(long *)((long)&local_1f8.data_[0].ptr + lVar6);
        uVar8 = 0;
        do {
          uVar9 = ((long)*(int *)(this + *(long *)(lVar3 + uVar8 * 8) * 8) ^ uVar7) * 0x200000 +
                  ~((long)*(int *)(this + *(long *)(lVar3 + uVar8 * 8) * 8) ^ uVar7);
          uVar9 = (uVar9 >> 0x18 ^ uVar9) * 0x109;
          uVar4 = ((uint)(uVar9 >> 0xe) ^ (uint)uVar9) * 0x15;
          uVar9 = (ulong)((uVar4 >> 0x1c ^ uVar4) & 7);
          if (local_278[uVar9] == 3) {
            bVar11 = uVar8 == 0;
            if (!bVar11) {
              if (local_2a8[0] == uVar9) goto LAB_0018ec6a;
              uVar5 = 1;
              do {
                uVar10 = uVar5;
                if (uVar8 == uVar10) break;
                uVar5 = uVar10 + 1;
              } while (local_2a8[uVar10] != uVar9);
              bVar11 = uVar8 <= uVar10;
            }
            if (!bVar11) goto LAB_0018ec6a;
            local_2a8[4] = uVar8 + 1;
            local_2a8[uVar8] = uVar9;
          }
          else {
LAB_0018ec6a:
            local_2a8[4] = 0;
            local_2b0 = (GetKey *)((ulong)((long)local_2b0 * 0xbc8f) % 0x7fffffff);
            uVar7 = (ulong)local_2b0 | 0x8000000000000000;
          }
          uVar8 = local_2a8[4];
        } while (local_2a8[4] < uVar1);
        local_278[(ulong)*(uint *)((long)&local_1f8.data_[0].hash + lVar6) + 8] = uVar7;
        if (uVar1 != 0) {
          lVar3 = *(long *)((long)&local_1f8.data_[0].ptr + lVar6);
          uVar8 = 0;
          do {
            local_278[local_2a8[uVar8]] = *(unsigned_long *)(lVar3 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (uVar1 != uVar8);
        }
      }
    }
    lVar6 = lVar6 + 0x10;
    if (lVar6 == 0x80) {
      __return_storage_ptr__->first_seed_ = local_178.seed;
      (__return_storage_ptr__->first_table_).data_[0].value_ = local_238;
      (__return_storage_ptr__->first_table_).data_[1].value_ = vStack_230;
      (__return_storage_ptr__->first_table_).data_[2].value_ = local_228;
      (__return_storage_ptr__->first_table_).data_[3].value_ = vStack_220;
      (__return_storage_ptr__->first_table_).data_[4].value_ = local_218;
      (__return_storage_ptr__->first_table_).data_[5].value_ = vStack_210;
      (__return_storage_ptr__->first_table_).data_[6].value_ = local_208;
      (__return_storage_ptr__->first_table_).data_[7].value_ = vStack_200;
      (__return_storage_ptr__->second_table_).data_[0] = local_278[0];
      (__return_storage_ptr__->second_table_).data_[1] = local_278[1];
      (__return_storage_ptr__->second_table_).data_[2] = local_278[2];
      (__return_storage_ptr__->second_table_).data_[3] = local_278[3];
      (__return_storage_ptr__->second_table_).data_[4] = local_278[4];
      (__return_storage_ptr__->second_table_).data_[5] = local_278[5];
      (__return_storage_ptr__->second_table_).data_[6] = local_278[6];
      (__return_storage_ptr__->second_table_).data_[7] = local_278[7];
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

pmh_tables<M, Hash> constexpr make_pmh_tables(const carray<Item, N> &
                                                               items,
                                                           Hash const &hash,
                                                           KeyEqual const &equal,
                                                           Key const &key,
                                                           PRG prg) {
  // Step 1: Place all of the keys into buckets
  auto step_one = make_pmh_buckets<M>(items, hash, key, prg);

#ifndef NDEBUG
  // Step 1.5: Detect redundant keys.
  for(auto const& bucket : step_one.buckets)
    for(std::size_t i = 1; i < bucket.size(); ++i)
      constexpr_assert(!equal(key(items[0]), key(items[i])), "unique keys");
#endif

  // Step 2: Sort the buckets to process the ones with the most items first.
  auto buckets = step_one.get_sorted_buckets();

  // Special value for unused slots. This is purposefully the index
  // one-past-the-end of 'items' to function as a sentinel value. Both to avoid
  // the need to apply the KeyEqual predicate and to be easily convertible to
  // end().
  // Unused entries in both hash tables (G and H) have to contain this value.
  const auto UNUSED = items.size();

  // G becomes the first hash table in the resulting pmh function
  carray<seed_or_index, M> G({false, UNUSED});

  // H becomes the second hash table in the resulting pmh function
  carray<std::size_t, M> H(UNUSED);

  // Step 3: Map the items in buckets into hash tables.
  for (const auto & bucket : buckets) {
    auto const bsize = bucket.size();

    if (bsize == 1) {
      // Store index to the (single) item in G
      // assert(bucket.hash == hash(key(items[bucket[0]]), step_one.seed) % M);
      G[bucket.hash] = {false, static_cast<std::uint64_t>(bucket[0])};
    } else if (bsize > 1) {

      // Repeatedly try different H of d until we find a hash function
      // that places all items in the bucket into free slots
      seed_or_index d{true, prg()};
      cvector<std::size_t, decltype(step_one)::bucket_max> bucket_slots;

      while (bucket_slots.size() < bsize) {
        auto slot = hash(key(items[bucket[bucket_slots.size()]]), static_cast<std::size_t>(d.value())) % M;

        if (H[slot] != UNUSED || !all_different_from(bucket_slots, slot)) {
          bucket_slots.clear();
          d = {true, prg()};
          continue;
        }

        bucket_slots.push_back(slot);
      }

      // Put successful seed in G, and put indices to items in their slots
      // assert(bucket.hash == hash(key(items[bucket[0]]), step_one.seed) % M);
      G[bucket.hash] = d;
      for (std::size_t i = 0; i < bsize; ++i)
        H[bucket_slots[i]] = bucket[i];
    }
  }

  return {step_one.seed, G, H, hash};
}